

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::PropertySymOpnd::ChangesObjectLayout(PropertySymOpnd *this)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 uVar4;
  TypeId TVar5;
  undefined4 *puVar6;
  JITType *pJVar7;
  JITTypeHandler *pJVar8;
  bool local_65;
  bool local_5b;
  bool local_5a;
  bool local_59;
  JITTypeHandler *initialTypeHandler;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder initialType;
  nullptr_t local_30;
  JITTypeHolderBase<void> local_28;
  JITTypeHolder finalType;
  JITTypeHolder cachedType;
  PropertySymOpnd *this_local;
  
  bVar2 = HasInitialType(this);
  if (bVar2) {
    finalType = GetInitialType(this);
  }
  else {
    bVar2 = IsMono(this);
    if (bVar2) {
      finalType = GetType(this);
    }
    else {
      finalType = GetFirstEquivalentType(this);
    }
  }
  local_28.t = (Type)GetFinalType(this);
  local_30 = (nullptr_t)0x0;
  bVar2 = JITTypeHolderBase<void>::operator!=(&local_28,&local_30);
  local_59 = false;
  if (bVar2) {
    pJVar7 = JITTypeHolderBase<void>::operator->(&local_28);
    TVar5 = JITType::GetTypeId(pJVar7);
    local_59 = Js::DynamicType::Is(TVar5);
  }
  if (local_59 == false) {
    bVar2 = HasInitialType(this);
    if (bVar2) {
      local_40.t = (Type)GetInitialType(this);
      initialTypeHandler = (JITTypeHandler *)0x0;
      bVar2 = JITTypeHolderBase<void>::operator!=(&local_40,&initialTypeHandler);
      local_65 = false;
      if (bVar2) {
        pJVar7 = JITTypeHolderBase<void>::operator->(&local_40);
        TVar5 = JITType::GetTypeId(pJVar7);
        local_65 = Js::DynamicType::Is(TVar5);
      }
      if (local_65 == false) {
        this_local._7_1_ = false;
      }
      else {
        pJVar7 = JITTypeHolderBase<void>::operator->(&local_40);
        pJVar8 = JITType::GetTypeHandler(pJVar7);
        this_local._7_1_ = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar8);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    initialType.t = (Type)0x0;
    bVar2 = JITTypeHolderBase<void>::operator!=(&finalType,&initialType.t);
    local_5a = false;
    if (bVar2) {
      pJVar7 = JITTypeHolderBase<void>::operator->(&finalType);
      TVar5 = JITType::GetTypeId(pJVar7);
      local_5a = Js::DynamicType::Is(TVar5);
    }
    if (((local_5a ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                         ,0x3ce,
                         "(cachedType != nullptr && Js::DynamicType::Is(cachedType->GetTypeId()))",
                         "cachedType != nullptr && Js::DynamicType::Is(cachedType->GetTypeId())");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pJVar7 = JITTypeHolderBase<void>::operator->(&finalType);
    pJVar8 = JITType::GetTypeHandler(pJVar7);
    uVar3 = JITTypeHandler::GetInlineSlotCapacity(pJVar8);
    pJVar7 = JITTypeHolderBase<void>::operator->(&local_28);
    pJVar8 = JITType::GetTypeHandler(pJVar7);
    uVar4 = JITTypeHandler::GetInlineSlotCapacity(pJVar8);
    local_5b = true;
    if (uVar3 == uVar4) {
      pJVar7 = JITTypeHolderBase<void>::operator->(&finalType);
      pJVar8 = JITType::GetTypeHandler(pJVar7);
      uVar3 = JITTypeHandler::GetOffsetOfInlineSlots(pJVar8);
      pJVar7 = JITTypeHolderBase<void>::operator->(&local_28);
      pJVar8 = JITType::GetTypeHandler(pJVar7);
      uVar4 = JITTypeHandler::GetOffsetOfInlineSlots(pJVar8);
      local_5b = uVar3 != uVar4;
    }
    this_local._7_1_ = local_5b;
  }
  return this_local._7_1_;
}

Assistant:

bool
PropertySymOpnd::ChangesObjectLayout() const
{
    JITTypeHolder cachedType = this->HasInitialType() ? this->GetInitialType() : 
        this->IsMono() ? this->GetType() : this->GetFirstEquivalentType();

    JITTypeHolder finalType = this->GetFinalType();

    if (finalType != nullptr && Js::DynamicType::Is(finalType->GetTypeId()))
    {
        // This is the case where final type opt may cause pro-active type transition to take place.

    Assert(cachedType != nullptr && Js::DynamicType::Is(cachedType->GetTypeId()));

    return cachedType->GetTypeHandler()->GetInlineSlotCapacity() != finalType->GetTypeHandler()->GetInlineSlotCapacity() ||
        cachedType->GetTypeHandler()->GetOffsetOfInlineSlots() != finalType->GetTypeHandler()->GetOffsetOfInlineSlots();
    }

    if (!this->HasInitialType())
    {
        return false;
    }

    JITTypeHolder initialType = this->GetInitialType();
    if (initialType != nullptr && Js::DynamicType::Is(initialType->GetTypeId()))
    {
        // This is the case where the type transition actually occurs. (This is the only case that's detectable
        // during the loop pre-pass, since final types are not in place yet.)

        const JITTypeHandler * initialTypeHandler = initialType->GetTypeHandler();

        // If no final type has been set in the forward pass, then we have no way of knowing how the object shape will evolve here.
        // If the initial type is object-header-inlined, assume that the layout may change.
        return initialTypeHandler->IsObjectHeaderInlinedTypeHandler();
    }

    return false;
}